

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O0

void TIFFFreeDirectory(TIFF *tif)

{
  int local_1c;
  int i;
  TIFFDirectory *td;
  TIFF *tif_local;
  
  _TIFFmemset(&tif->tif_dir,0,0x10);
  if ((tif->tif_dir).td_sminsamplevalue != (double *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_sminsamplevalue);
    (tif->tif_dir).td_sminsamplevalue = (double *)0x0;
  }
  if ((tif->tif_dir).td_smaxsamplevalue != (double *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_smaxsamplevalue);
    (tif->tif_dir).td_smaxsamplevalue = (double *)0x0;
  }
  if ((tif->tif_dir).td_colormap[0] != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_colormap[0]);
    (tif->tif_dir).td_colormap[0] = (uint16_t *)0x0;
  }
  if ((tif->tif_dir).td_colormap[1] != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_colormap[1]);
    (tif->tif_dir).td_colormap[1] = (uint16_t *)0x0;
  }
  if ((tif->tif_dir).td_colormap[2] != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_colormap[2]);
    (tif->tif_dir).td_colormap[2] = (uint16_t *)0x0;
  }
  if ((tif->tif_dir).td_sampleinfo != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_sampleinfo);
    (tif->tif_dir).td_sampleinfo = (uint16_t *)0x0;
  }
  if ((tif->tif_dir).td_subifd != (uint64_t *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_subifd);
    (tif->tif_dir).td_subifd = (uint64_t *)0x0;
  }
  if ((tif->tif_dir).td_inknames != (char *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_inknames);
    (tif->tif_dir).td_inknames = (char *)0x0;
  }
  if ((tif->tif_dir).td_refblackwhite != (float *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_refblackwhite);
    (tif->tif_dir).td_refblackwhite = (float *)0x0;
  }
  if ((tif->tif_dir).td_transferfunction[0] != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_transferfunction[0]);
    (tif->tif_dir).td_transferfunction[0] = (uint16_t *)0x0;
  }
  if ((tif->tif_dir).td_transferfunction[1] != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_transferfunction[1]);
    (tif->tif_dir).td_transferfunction[1] = (uint16_t *)0x0;
  }
  if ((tif->tif_dir).td_transferfunction[2] != (uint16_t *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_transferfunction[2]);
    (tif->tif_dir).td_transferfunction[2] = (uint16_t *)0x0;
  }
  if ((tif->tif_dir).td_stripoffset_p != (uint64_t *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_stripoffset_p);
    (tif->tif_dir).td_stripoffset_p = (uint64_t *)0x0;
  }
  if ((tif->tif_dir).td_stripbytecount_p != (uint64_t *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_stripbytecount_p);
    (tif->tif_dir).td_stripbytecount_p = (uint64_t *)0x0;
  }
  (tif->tif_dir).td_stripoffsetbyteallocsize = 0;
  (tif->tif_dir).td_fieldsset[1] = (tif->tif_dir).td_fieldsset[1] & 0xffffff7f;
  (tif->tif_dir).td_fieldsset[1] = (tif->tif_dir).td_fieldsset[1] & 0xfffffeff;
  for (local_1c = 0; local_1c < (tif->tif_dir).td_customValueCount; local_1c = local_1c + 1) {
    if ((tif->tif_dir).td_customValues[local_1c].value != (void *)0x0) {
      _TIFFfreeExt(tif,(tif->tif_dir).td_customValues[local_1c].value);
    }
  }
  (tif->tif_dir).td_customValueCount = 0;
  if ((tif->tif_dir).td_customValues != (TIFFTagValue *)0x0) {
    _TIFFfreeExt(tif,(tif->tif_dir).td_customValues);
    (tif->tif_dir).td_customValues = (TIFFTagValue *)0x0;
  }
  _TIFFmemset(&(tif->tif_dir).td_stripoffset_entry,0,0x20);
  _TIFFmemset(&(tif->tif_dir).td_stripbytecount_entry,0,0x20);
  return;
}

Assistant:

void TIFFFreeDirectory(TIFF *tif)
{
    TIFFDirectory *td = &tif->tif_dir;
    int i;

    _TIFFmemset(td->td_fieldsset, 0, sizeof(td->td_fieldsset));
    CleanupField(td_sminsamplevalue);
    CleanupField(td_smaxsamplevalue);
    CleanupField(td_colormap[0]);
    CleanupField(td_colormap[1]);
    CleanupField(td_colormap[2]);
    CleanupField(td_sampleinfo);
    CleanupField(td_subifd);
    CleanupField(td_inknames);
    CleanupField(td_refblackwhite);
    CleanupField(td_transferfunction[0]);
    CleanupField(td_transferfunction[1]);
    CleanupField(td_transferfunction[2]);
    CleanupField(td_stripoffset_p);
    CleanupField(td_stripbytecount_p);
    td->td_stripoffsetbyteallocsize = 0;
    TIFFClrFieldBit(tif, FIELD_YCBCRSUBSAMPLING);
    TIFFClrFieldBit(tif, FIELD_YCBCRPOSITIONING);

    /* Cleanup custom tag values */
    for (i = 0; i < td->td_customValueCount; i++)
    {
        if (td->td_customValues[i].value)
            _TIFFfreeExt(tif, td->td_customValues[i].value);
    }

    td->td_customValueCount = 0;
    CleanupField(td_customValues);

    _TIFFmemset(&(td->td_stripoffset_entry), 0, sizeof(TIFFDirEntry));
    _TIFFmemset(&(td->td_stripbytecount_entry), 0, sizeof(TIFFDirEntry));
}